

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O0

bool google::protobuf::json_internal::Proto3Type::Is32Bit(Field f)

{
  Field_Kind FVar1;
  Field *this;
  Field f_local;
  
  this = ResolverPool::Field::proto(f);
  FVar1 = Field::kind(this);
  if ((((FVar1 == Field_Kind_TYPE_FLOAT) || (FVar1 == Field_Kind_TYPE_INT32)) ||
      (FVar1 == Field_Kind_TYPE_FIXED32)) ||
     (((FVar1 == Field_Kind_TYPE_UINT32 || (FVar1 == Field_Kind_TYPE_SFIXED32)) ||
      (FVar1 == Field_Kind_TYPE_SINT32)))) {
    f_local._7_1_ = true;
  }
  else {
    f_local._7_1_ = false;
  }
  return f_local._7_1_;
}

Assistant:

static bool Is32Bit(Field f) {
    switch (f->proto().kind()) {
      case google::protobuf::Field::TYPE_INT32:
      case google::protobuf::Field::TYPE_SINT32:
      case google::protobuf::Field::TYPE_UINT32:
      case google::protobuf::Field::TYPE_FIXED32:
      case google::protobuf::Field::TYPE_SFIXED32:
      case google::protobuf::Field::TYPE_FLOAT:
        return true;
      default:
        return false;
    }
  }